

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O2

void __thiscall TPZGaussRule::SetType(TPZGaussRule *this,int *type,int order)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  if (-1 < order) {
    iVar2 = order;
  }
  if (3 < (uint)*type) {
    *type = 0;
  }
  TPZVec<long_double>::Resize(&this->fLocation,0);
  TPZVec<long_double>::Resize(&this->fWeight,0);
  iVar1 = *type;
  this->fType = iVar1;
  if (iVar1 != 3) {
    if (iVar1 == 2) {
      ComputingGaussJacobiQuadrature(this,iVar2,this->fAlpha,this->fBeta);
    }
    else {
      if (iVar1 == 1) {
        iVar2 = ComputingGaussLobattoQuadrature(this,iVar2);
      }
      else {
        iVar2 = ComputingGaussLegendreQuadrature(this,iVar2);
      }
      if (iVar2 < 0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Integral/tpzgaussrule.cpp"
                   ,0xa4);
      }
    }
    return;
  }
  ComputingGaussChebyshevQuadrature(this,iVar2);
  return;
}

Assistant:

void TPZGaussRule::SetType(int &type,int order) {
	if(order < 0) order = 1;
	if(type < 0 || type > 3) type = 0;
		fLocation.Resize(0);
		fWeight.Resize(0);
		fType = type;
    int neworder;
		switch(type) {
			case 1:   // Lobatto
			{
				// Computing the points and weights for the symmetric Gaussian quadrature (using Legendre polynomials) 
				neworder=ComputingGaussLobattoQuadrature(order);
			}
				break;
			case 2:   // Jacobi
			{
				// Computing the points and weights for the symmetric Gaussian quadrature (using Legendre polynomials) 
				neworder=ComputingGaussJacobiQuadrature(order,fAlpha,fBeta);
			}
				break;
			case 3:  // Chebyshev
			{
				neworder=ComputingGaussChebyshevQuadrature(order);
			}
				break;
			default:     // Legendre (default)
			{
				// Computing the points and weights for the symmetric Gaussian quadrature (using Legendre polynomials) 
				neworder=ComputingGaussLegendreQuadrature(order);
			}
				break;
		}
    if(neworder < 0)
        DebugStop();
}